

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O0

int ReturnTest(void)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_3c0;
  AssertionHelper local_3a0;
  int local_370;
  AssertionReturnType<int> local_36c;
  Fixed local_368;
  ReturnTypedFixed<int> local_1e0;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  
  iutest::detail::AlwaysZero();
  local_39 = true;
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_368,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_368);
    local_370 = -1;
    local_36c = iutest::AssertionReturn<int>(&local_370);
    iutest::AssertionHelper::Fixed::operator<<(&local_1e0,&local_368,&local_36c);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_3c0,(internal *)local_38,(AssertionResult *)"true","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_3a0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp"
               ,0x36,message,kFatalFailure);
    iutest_ar._36_4_ = iutest::AssertionHelper::operator=(&local_3a0,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_3c0);
    iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1e0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_368);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (bVar1) {
    iutest_ar._36_4_ = 0;
  }
  return iutest_ar._36_4_;
}

Assistant:

int ReturnTest()
{
    IUTEST_ASSERT_TRUE(true) << ::iutest::AssertionReturn(-1);
    return 0;
}